

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void __thiscall
flatbuffers::ResizeContext::ResizeTable(ResizeContext *this,Object *objectdef,Table *table)

{
  Table *table_00;
  Table *pTVar1;
  int iVar2;
  pointer puVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  Field *pFVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  Field *pFVar11;
  pointer puVar12;
  Table *pTVar13;
  uint uVar14;
  Object *pOVar15;
  Field FVar16;
  Schema *pSVar17;
  ushort uVar18;
  ushort uVar19;
  ulong uVar20;
  Table *pTVar21;
  uint8_t *offset_location;
  Object *pOVar22;
  
  puVar12 = (this->dag_check_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)table -
          (long)(this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start >> 2;
  if (puVar12[lVar8] == '\0') {
    iVar2 = *(int *)table;
    if (table < (Table *)this->startptr_) {
      if (*(ushort *)(objectdef + -(long)*(int *)objectdef) < 7) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ushort *)(objectdef + (6 - (long)*(int *)objectdef));
      }
      uVar9 = (ulong)uVar4;
      uVar10 = (ulong)*(uint *)(objectdef + uVar9);
      if ((*(uint *)(objectdef + uVar10 + uVar9) & 0x3fffffff) != 0) {
        pOVar22 = objectdef + uVar10 + uVar9 + 4;
        do {
          pFVar7 = (Field *)(pOVar22 + *(uint *)pOVar22);
          lVar8 = -(long)*(int *)(pOVar22 + *(uint *)pOVar22);
          uVar4 = *(ushort *)(pFVar7 + -(long)*(int *)(pOVar22 + *(uint *)pOVar22));
          if (uVar4 < 7) {
            uVar18 = 0;
          }
          else {
            uVar18 = *(ushort *)(pFVar7 + lVar8 + 6);
          }
          if (uVar18 == 0) {
            pFVar11 = (Field *)0x0;
          }
          else {
            pFVar11 = pFVar7 + (ulong)*(uint *)(pFVar7 + uVar18) + (ulong)uVar18;
          }
          iVar5 = 0;
          uVar18 = 0;
          if (4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) {
            uVar18 = *(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11));
          }
          if (uVar18 != 0) {
            iVar5 = (int)(char)pFVar11[uVar18].super_Table;
          }
          if (0xc < iVar5) {
            if (uVar4 < 0xb) {
              uVar18 = 0;
            }
            else {
              uVar18 = *(ushort *)(pFVar7 + lVar8 + 10);
            }
            if (uVar18 == 0) {
              uVar18 = 0;
            }
            else {
              uVar18 = *(ushort *)(pFVar7 + uVar18);
            }
            if (uVar18 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar18 = *(ushort *)(table + ((ulong)uVar18 - (long)*(int *)table));
            }
            else {
              uVar18 = 0;
            }
            if (uVar18 != 0) {
              if (iVar5 == 0xf) {
                pSVar17 = this->schema_;
                if (*(ushort *)(pSVar17 + -(long)*(int *)pSVar17) < 5) {
                  uVar19 = 0;
                }
                else {
                  uVar19 = *(ushort *)(pSVar17 + (4 - (long)*(int *)pSVar17));
                }
                if (uVar19 == 0) {
                  pSVar17 = (Schema *)0x0;
                }
                else {
                  pSVar17 = pSVar17 + (ulong)*(uint *)(pSVar17 + uVar19) + (ulong)uVar19;
                }
                if (uVar4 < 7) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = *(ushort *)(pFVar7 + lVar8 + 6);
                }
                if (uVar4 == 0) {
                  pFVar11 = (Field *)0x0;
                }
                else {
                  pFVar11 = pFVar7 + (ulong)*(uint *)(pFVar7 + uVar4) + (ulong)uVar4;
                }
                if (*(ushort *)(pFVar11 + -(long)*(int *)pFVar11) < 9) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = *(ushort *)(pFVar11 + (8 - (long)*(int *)pFVar11));
                }
                if (uVar4 == 0) {
                  uVar14 = 0xffffffff;
                }
                else {
                  uVar14 = *(uint *)(pFVar11 + uVar4);
                }
                if (*(uint *)pSVar17 <= uVar14) goto LAB_0014ef13;
                pOVar15 = (Object *)
                          (pSVar17 +
                          (ulong)*(uint *)(pSVar17 + (ulong)(uVar14 << 2) + 4) +
                          (ulong)(uVar14 << 2) + 4);
              }
              else {
                pOVar15 = (Object *)0x0;
              }
              if (pOVar15 != (Object *)0x0) {
                if (*(ushort *)(pOVar15 + -(long)*(int *)pOVar15) < 9) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = *(ushort *)(pOVar15 + (8 - (long)*(int *)pOVar15));
                }
                if ((uVar4 != 0) && (pOVar15[uVar4].super_Table != (Table)0x0))
                goto switchD_0014eca7_caseD_d;
              }
              pTVar13 = table + uVar18;
              puVar12 = (this->dag_check_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar8 = (long)pTVar13 -
                      (long)(this->buf_->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 2;
              if (puVar12[lVar8] == '\0') {
                uVar14 = *(uint *)pTVar13;
                table_00 = pTVar13 + uVar14;
                if ((Table *)this->startptr_ <= table_00 && pTVar13 <= (Table *)this->startptr_) {
                  *(uint *)pTVar13 = this->delta_ + uVar14;
                  puVar12[lVar8] = '\x01';
                }
                switch(iVar5) {
                case 0xd:
                  break;
                case 0xe:
                  lVar8 = -(long)*(int *)pFVar7;
                  if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 7) {
                    uVar4 = 0;
                  }
                  else {
                    uVar4 = *(ushort *)(pFVar7 + lVar8 + 6);
                  }
                  if (uVar4 == 0) {
                    pFVar11 = (Field *)0x0;
                  }
                  else {
                    pFVar11 = pFVar7 + (ulong)*(uint *)(pFVar7 + uVar4) + (ulong)uVar4;
                  }
                  FVar16.super_Table = (Table)0x0;
                  uVar4 = 0;
                  if (6 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) {
                    uVar4 = *(ushort *)(pFVar11 + (6 - (long)*(int *)pFVar11));
                  }
                  if (uVar4 != 0) {
                    FVar16.super_Table = pFVar11[uVar4].super_Table;
                  }
                  if (((byte)FVar16.super_Table & 0xfd) == 0xd) {
                    if (FVar16.super_Table == (Table)0xf) {
                      pSVar17 = this->schema_;
                      if (*(ushort *)(pSVar17 + -(long)*(int *)pSVar17) < 5) {
                        uVar4 = 0;
                      }
                      else {
                        uVar4 = *(ushort *)(pSVar17 + (4 - (long)*(int *)pSVar17));
                      }
                      if (uVar4 == 0) {
                        pSVar17 = (Schema *)0x0;
                      }
                      else {
                        pSVar17 = pSVar17 + (ulong)*(uint *)(pSVar17 + uVar4) + (ulong)uVar4;
                      }
                      if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 7) {
                        uVar4 = 0;
                      }
                      else {
                        uVar4 = *(ushort *)(pFVar7 + lVar8 + 6);
                      }
                      if (uVar4 == 0) {
                        pFVar7 = (Field *)0x0;
                      }
                      else {
                        pFVar7 = pFVar7 + (ulong)*(uint *)(pFVar7 + uVar4) + (ulong)uVar4;
                      }
                      if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 9) {
                        uVar4 = 0;
                      }
                      else {
                        uVar4 = *(ushort *)(pFVar7 + (8 - (long)*(int *)pFVar7));
                      }
                      if (uVar4 == 0) {
                        uVar6 = 0xffffffff;
                      }
                      else {
                        uVar6 = *(uint *)(pFVar7 + uVar4);
                      }
                      if (*(uint *)pSVar17 <= uVar6) {
LAB_0014ef13:
                        __assert_fail("i < size()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                                      ,0xc1,
                                      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                                     );
                      }
                      pOVar15 = (Object *)
                                (pSVar17 +
                                (ulong)*(uint *)(pSVar17 + (ulong)(uVar6 << 2) + 4) +
                                (ulong)(uVar6 << 2) + 4);
                    }
                    else {
                      pOVar15 = (Object *)0x0;
                    }
                    if (pOVar15 != (Object *)0x0) {
                      if (*(ushort *)(pOVar15 + -(long)*(int *)pOVar15) < 9) {
                        uVar4 = 0;
                      }
                      else {
                        uVar4 = *(ushort *)(pOVar15 + (8 - (long)*(int *)pOVar15));
                      }
                      if ((uVar4 != 0) && (pOVar15[uVar4].super_Table != (Table)0x0)) break;
                    }
                    if (*(int *)table_00 != 0) {
                      pTVar13 = table + (ulong)uVar18 + 4;
                      pTVar21 = table + (ulong)uVar18 + 4;
                      uVar20 = 0;
                      do {
                        puVar12 = (this->buf_->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start;
                        puVar3 = (this->dag_check_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        if (puVar3[(long)(pTVar21 + ((ulong)uVar14 - (long)puVar12)) >> 2] == '\0')
                        {
                          pTVar1 = pTVar13 + uVar14;
                          uVar6 = *(uint *)(pTVar13 + uVar14);
                          if ((pTVar1 <= (Table *)this->startptr_) &&
                             ((Table *)this->startptr_ <= pTVar1 + uVar6)) {
                            *(int *)pTVar1 = *(int *)pTVar1 + this->delta_;
                            puVar3[(long)(pTVar21 + ((ulong)uVar14 - (long)puVar12)) >> 2] = '\x01';
                          }
                          if (pOVar15 != (Object *)0x0) {
                            ResizeTable(this,pOVar15,pTVar1 + uVar6);
                          }
                        }
                        uVar20 = uVar20 + 1;
                        pTVar13 = pTVar13 + 4;
                        pTVar21 = pTVar21 + 4;
                      } while (uVar20 < *(uint *)table_00);
                    }
                  }
                  break;
                case 0xf:
                  if (pOVar15 != (Object *)0x0) goto LAB_0014ece2;
                  break;
                case 0x10:
                  pOVar15 = GetUnionType(this->schema_,objectdef,pFVar7,table);
LAB_0014ece2:
                  ResizeTable(this,pOVar15,table_00);
                  break;
                default:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                                ,0x221,
                                "void flatbuffers::ResizeContext::ResizeTable(const reflection::Object &, Table *)"
                               );
                }
              }
            }
          }
switchD_0014eca7_caseD_d:
          pOVar22 = pOVar22 + 4;
        } while (pOVar22 !=
                 objectdef + uVar10 + uVar9 + 4 + (uint)(*(int *)(objectdef + uVar10 + uVar9) << 2))
        ;
      }
      if (table + -(long)iVar2 < (Table *)this->startptr_ || (Table *)this->startptr_ < table) {
        return;
      }
      *(int *)table = *(int *)table - this->delta_;
      puVar12 = (this->dag_check_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start +
                ((long)table -
                 (long)(this->buf_->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
    }
    else {
      if ((Table *)this->startptr_ < table + -(long)iVar2) {
        return;
      }
      puVar12 = puVar12 + lVar8;
      *(int *)table = iVar2 - this->delta_;
    }
    *puVar12 = '\x01';
  }
  return;
}

Assistant:

uint8_t &DagCheck(const void *offsetloc) {
    auto dag_idx = reinterpret_cast<const uoffset_t *>(offsetloc) -
                   reinterpret_cast<const uoffset_t *>(buf_.data());
    return dag_check_[dag_idx];
  }